

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

curl_mime * curl_mime_init(Curl_easy *easy)

{
  CURLcode CVar1;
  curl_mime *pcVar2;
  
  pcVar2 = (curl_mime *)(*Curl_cmalloc)(0x68);
  if (pcVar2 != (curl_mime *)0x0) {
    pcVar2->easy = easy;
    pcVar2->parent = (curl_mimepart *)0x0;
    pcVar2->firstpart = (curl_mimepart *)0x0;
    pcVar2->lastpart = (curl_mimepart *)0x0;
    builtin_strncpy(pcVar2->boundary,"------------------------",0x18);
    CVar1 = Curl_rand_hex(easy,(uchar *)(pcVar2->boundary + 0x18),0x11);
    if (CVar1 == CURLE_OK) {
      (pcVar2->state).state = MIMESTATE_BEGIN;
      (pcVar2->state).ptr = (void *)0x0;
      (pcVar2->state).offset = 0;
      return pcVar2;
    }
    (*Curl_cfree)(pcVar2);
  }
  return (curl_mime *)0x0;
}

Assistant:

curl_mime *curl_mime_init(struct Curl_easy *easy)
{
  curl_mime *mime;

  mime = (curl_mime *) malloc(sizeof(*mime));

  if(mime) {
    mime->easy = easy;
    mime->parent = NULL;
    mime->firstpart = NULL;
    mime->lastpart = NULL;

    memset(mime->boundary, '-', 24);
    if(Curl_rand_hex(easy, (unsigned char *) &mime->boundary[24],
                     MIME_RAND_BOUNDARY_CHARS + 1)) {
      /* failed to get random separator, bail out */
      free(mime);
      return NULL;
    }
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);
  }

  return mime;
}